

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDLGraphicsSystemTests.cpp
# Opt level: O1

void __thiscall
solitaire::graphics::SDLGraphicsSystemTests::
expectThrowIfSDLCreateRendererFailedDuringWindowCreation(SDLGraphicsSystemTests *this)

{
  FunctionMocker<void_()> *this_00;
  int iVar1;
  WrapperMock *this_01;
  PtrDeleterMock *this_02;
  StrictMock<solitaire::SDL::WrapperMock> *mock_obj;
  bool bVar2;
  TypedExpectation<int_(unsigned_int)> *this_03;
  ActionInterface<int_(unsigned_int)> *impl;
  TypedExpectation<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int,_int,_int,_unsigned_int)>
  *this_04;
  TypedExpectation<std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_(const_std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_&,_int,_unsigned_int)>
  *this_05;
  ActionInterface<std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_(const_std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_&,_int,_unsigned_int)>
  *impl_00;
  unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_> *x;
  TrueWithString gtest_msg;
  undefined1 local_d8 [16];
  undefined1 local_c8 [24];
  undefined1 local_b0 [16];
  pointer local_a0;
  MatcherBase<unsigned_int> local_90;
  int *local_78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_70;
  unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_> local_68;
  unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_> local_40;
  
  this_01 = &((this->sdlMock).rawPointer)->super_WrapperMock;
  testing::Matcher<unsigned_int>::Matcher((Matcher<unsigned_int> *)&local_90,0x20);
  SDL::WrapperMock::gmock_init
            ((MockSpec<int_(unsigned_int)> *)local_d8,this_01,(Matcher<unsigned_int> *)&local_90);
  testing::internal::GetWithoutMatchers();
  this_03 = testing::internal::MockSpec<int_(unsigned_int)>::InternalExpectedAt
                      ((MockSpec<int_(unsigned_int)> *)local_d8,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/graphics/SDLGraphicsSystemTests.cpp"
                       ,0x5a,"*sdlMock","init(0x00000020u)");
  local_78 = (int *)operator_new(4);
  *local_78 = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<int*>(&local_70,local_78);
  impl = (ActionInterface<int_(unsigned_int)> *)operator_new(0x10);
  impl->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_0032f640;
  iVar1 = *local_78;
  *(int *)&impl[1]._vptr_ActionInterface = iVar1;
  *(int *)((long)&impl[1]._vptr_ActionInterface + 4) = iVar1;
  testing::Action<int_(unsigned_int)>::Action((Action<int_(unsigned_int)> *)(local_c8 + 0x18),impl);
  testing::internal::TypedExpectation<int_(unsigned_int)>::WillOnce
            (this_03,(Action<int_(unsigned_int)> *)(local_c8 + 0x18));
  if (local_a0 != (pointer)0x0) {
    (*(code *)local_a0)(local_c8 + 0x18,local_c8 + 0x18,3);
  }
  if (local_70._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_70._M_pi);
  }
  testing::internal::MatcherBase<unsigned_int>::~MatcherBase
            ((MatcherBase<unsigned_int> *)(local_d8 + 8));
  testing::internal::MatcherBase<unsigned_int>::~MatcherBase(&local_90);
  this_04 = expectSDLCreateWindow
                      (this,(string *)(anonymous_namespace)::title_abi_cxx11_,0x280,0x348);
  makeSDLWindow((UniquePtr<SDL_Window> *)&local_40,this,(SDL_Window_conflict *)0x1);
  testing::ByMove<std::unique_ptr<SDL_Window,std::function<void(SDL_Window*)>>>
            ((ByMoveWrapper<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_> *)
             &local_68,(testing *)&local_40,x);
  testing::
  Return<testing::internal::ByMoveWrapper<std::unique_ptr<SDL_Window,std::function<void(SDL_Window*)>>>>
            ((testing *)(local_c8 + 0x18),
             (ByMoveWrapper<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_> *)
             &local_68);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((Action<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int,_int,_int,_unsigned_int)>
              *)local_d8,(ReturnAction *)(local_c8 + 0x18));
  testing::internal::
  TypedExpectation<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int,_int,_int,_unsigned_int)>
  ::WillOnce(this_04,(Action<std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int,_int,_int,_unsigned_int)>
                      *)local_d8);
  if ((VTable *)local_c8._0_8_ != (VTable *)0x0) {
    (*(code *)local_c8._0_8_)(local_d8,local_d8,3);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._8_8_);
  }
  std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>::~unique_ptr(&local_68);
  std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>::~unique_ptr(&local_40);
  this_05 = expectSDLCreateRenderer(this,(SDL_Window_conflict *)0x1);
  impl_00 = (ActionInterface<std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_(const_std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_&,_int,_unsigned_int)>
             *)operator_new(0x10);
  impl_00->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_0032ea48;
  testing::
  Action<std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_(const_std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_&,_int,_unsigned_int)>
  ::Action((Action<std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_(const_std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_&,_int,_unsigned_int)>
            *)local_d8,impl_00);
  testing::internal::
  TypedExpectation<std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_(const_std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_&,_int,_unsigned_int)>
  ::WillOnce(this_05,(Action<std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_(const_std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>_&,_int,_unsigned_int)>
                      *)local_d8);
  if ((VTable *)local_c8._0_8_ != (VTable *)0x0) {
    (*(code *)local_c8._0_8_)(local_d8,local_d8,3);
  }
  this_02 = &((this->ptrDeleterMock).
              super___shared_ptr<testing::StrictMock<solitaire::SDL::PtrDeleterMock>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr)->super_PtrDeleterMock;
  testing::Matcher<SDL_Window_*>::Matcher
            ((Matcher<SDL_Window_*> *)(local_c8 + 0x18),(Snapshot *)0x1);
  SDL::PtrDeleterMock::gmock_windowDeleter
            ((MockSpec<void_(SDL_Window_*)> *)local_d8,this_02,
             (Matcher<SDL_Window_*> *)(local_c8 + 0x18));
  testing::internal::GetWithoutMatchers();
  testing::internal::MockSpec<void_(SDL_Window_*)>::InternalExpectedAt
            ((MockSpec<void_(SDL_Window_*)> *)local_d8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/graphics/SDLGraphicsSystemTests.cpp"
             ,0x5e,"*ptrDeleterMock","windowDeleter(windowPtr)");
  testing::internal::MatcherBase<SDL_Window_*>::~MatcherBase
            ((MatcherBase<SDL_Window_*> *)(local_d8 + 8));
  testing::internal::MatcherBase<SDL_Window_*>::~MatcherBase
            ((MatcherBase<SDL_Window_*> *)(local_c8 + 0x18));
  mock_obj = (this->sdlMock).rawPointer;
  this_00 = &(mock_obj->super_WrapperMock).gmock10_quit_12;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            (&this_00->super_UntypedFunctionMockerBase,mock_obj);
  local_d8._0_8_ = this_00;
  testing::internal::GetWithoutMatchers();
  testing::internal::MockSpec<void_()>::InternalExpectedAt
            ((MockSpec<void_()> *)local_d8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/graphics/SDLGraphicsSystemTests.cpp"
             ,0x5f,"*sdlMock","quit()");
  local_c8._8_8_ = (void *)0x0;
  local_d8._8_8_ = (_func_int **)0x0;
  local_c8._0_8_ = (VTable *)0x0;
  local_d8._0_8_ = (FunctionMocker<int_(unsigned_int)> *)local_c8;
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    SDLGraphicsSystem::createWindow
              (&this->system,(string *)(anonymous_namespace)::title_abi_cxx11_,0x280,0x348);
  }
  std::__cxx11::string::_M_replace((ulong)local_d8,0,(char *)local_d8._8_8_,0x28ee90);
  testing::Message::Message((Message *)(local_c8 + 0x18));
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_90,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/graphics/SDLGraphicsSystemTests.cpp"
             ,100,(char *)local_d8._0_8_);
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)(local_c8 + 0x18))
  ;
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
  if ((pointer)local_b0._0_8_ != (pointer)0x0) {
    (**(code **)((long)*(void **)local_b0._0_8_ + 8))();
  }
  if ((FunctionMocker<int_(unsigned_int)> *)local_d8._0_8_ !=
      (FunctionMocker<int_(unsigned_int)> *)local_c8) {
    operator_delete((void *)local_d8._0_8_,
                    (ulong)((long)(_func_bool_MatcherBase<unsigned_int>_ptr_uint_ptr_MatchResultListener_ptr
                                   **)local_c8._0_8_ + 1));
  }
  return;
}

Assistant:

void expectThrowIfSDLCreateRendererFailedDuringWindowCreation() {
        EXPECT_CALL(*sdlMock, init(SDL_INIT_VIDEO)).WillOnce(Return(success));
        expectSDLCreateWindow(title, windowWidth, windowHeight)
            .WillOnce(Return(ByMove(makeSDLWindow(windowPtr))));
        expectSDLCreateRenderer(windowPtr).WillOnce(ReturnNull());
        EXPECT_CALL(*ptrDeleterMock, windowDeleter(windowPtr));
        EXPECT_CALL(*sdlMock, quit());

        EXPECT_THROW(
            system.createWindow(title, windowWidth, windowHeight),
            std::runtime_error
        );
    }